

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaRead.c
# Opt level: O3

Pla_Man_t * Pla_ReadPla(char *pFileName)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  int iVar3;
  char *pBuffer;
  char *pcVar4;
  Vec_Str_t *vLits;
  Pla_Man_t *p;
  size_t sVar5;
  int *piVar6;
  word *pwVar7;
  char cVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int Type;
  int nOuts;
  int nIns;
  char *pLimit;
  Pla_File_t local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  char *local_40;
  Vec_Str_t *local_38;
  
  pBuffer = Pla_ReadFile(pFileName,&local_40);
  pcVar4 = pBuffer;
  if (pBuffer == (char *)0x0) {
    p = (Pla_Man_t *)0x0;
  }
  else {
    for (; pcVar4 < local_40; pcVar4 = pcVar4 + 1) {
      if (*pcVar4 == '#') {
        cVar8 = '#';
        while ((cVar8 != '\0' && (cVar8 != '\n'))) {
          *pcVar4 = ' ';
          pcVar1 = pcVar4 + 1;
          pcVar4 = pcVar4 + 1;
          cVar8 = *pcVar1;
        }
      }
    }
    iVar3 = Pla_ReadPlaHeader(pBuffer,local_40,(int *)&local_44,(int *)&local_48,(int *)&local_4c,
                              (int *)&local_50);
    if (iVar3 == 0) {
      p = (Pla_Man_t *)0x0;
    }
    else {
      vLits = Pla_ReadPlaBody(pBuffer,local_40,local_50);
      if (vLits->nSize % (int)(local_44 + local_48) == 0) {
        uVar10 = vLits->nSize / (int)(local_44 + local_48);
        if (local_4c != 0xffffffff) {
          uVar10 = local_4c;
        }
        local_38 = vLits;
        p = (Pla_Man_t *)calloc(1,0x98);
        pcVar4 = Extra_FileDesignName(pFileName);
        p->pName = pcVar4;
        if (pFileName == (char *)0x0) {
          pcVar4 = (char *)0x0;
        }
        else {
          sVar5 = strlen(pFileName);
          pcVar4 = (char *)malloc(sVar5 + 1);
          strcpy(pcVar4,pFileName);
        }
        p->pSpec = pcVar4;
        p->nIns = local_44;
        p->nOuts = local_48;
        iVar3 = (((int)local_44 >> 5) + 1) - (uint)((local_44 & 0x1f) == 0);
        p->nInWords = iVar3;
        iVar12 = (((int)local_48 >> 5) + 1) - (uint)((local_48 & 0x1f) == 0);
        p->nOutWords = iVar12;
        if (0 < (int)uVar10) {
          piVar6 = (int *)malloc((ulong)uVar10 * 4);
          (p->vCubes).pArray = piVar6;
          if (piVar6 == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          (p->vCubes).nCap = uVar10;
          auVar2 = _DAT_008403e0;
          lVar13 = (ulong)uVar10 - 1;
          auVar14._8_4_ = (int)lVar13;
          auVar14._0_8_ = lVar13;
          auVar14._12_4_ = (int)((ulong)lVar13 >> 0x20);
          uVar9 = 0;
          auVar14 = auVar14 ^ _DAT_008403e0;
          auVar15 = _DAT_008403d0;
          do {
            auVar16 = auVar15 ^ auVar2;
            if ((bool)(~(auVar16._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar16._0_4_ ||
                        auVar14._4_4_ < auVar16._4_4_) & 1)) {
              piVar6[uVar9] = (int)uVar9;
            }
            if ((auVar16._12_4_ != auVar14._12_4_ || auVar16._8_4_ <= auVar14._8_4_) &&
                auVar16._12_4_ <= auVar14._12_4_) {
              piVar6[uVar9 + 1] = (int)uVar9 + 1;
            }
            uVar9 = uVar9 + 2;
            lVar13 = auVar15._8_8_;
            auVar15._0_8_ = auVar15._0_8_ + 2;
            auVar15._8_8_ = lVar13 + 2;
          } while ((uVar10 + 1 & 0xfffffffe) != uVar9);
        }
        (p->vCubes).nSize = uVar10;
        uVar11 = iVar3 * uVar10;
        if (0 < (int)uVar11) {
          pwVar7 = (word *)malloc((ulong)uVar11 * 8);
          (p->vInBits).pArray = pwVar7;
          if (pwVar7 == (word *)0x0) goto LAB_00372504;
          (p->vInBits).nCap = uVar11;
          memset(pwVar7,0,(ulong)uVar11 << 3);
        }
        vLits = local_38;
        (p->vInBits).nSize = uVar11;
        uVar10 = uVar10 * iVar12;
        if (0 < (int)uVar10) {
          pwVar7 = (word *)malloc((ulong)uVar10 * 8);
          (p->vOutBits).pArray = pwVar7;
          if (pwVar7 == (word *)0x0) {
LAB_00372504:
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                          ,0x1e4,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
          }
          (p->vOutBits).nCap = uVar10;
          memset(pwVar7,0,(ulong)uVar10 << 3);
        }
        (p->vOutBits).nSize = uVar10;
        p->Type = local_50;
        Pla_ReadAddBody(p,vLits);
      }
      else {
        p = (Pla_Man_t *)0x0;
        printf("Literal count is incorrect (in = %d; out = %d; lit = %d).\n",(ulong)local_44,
               (ulong)local_48);
      }
      if (vLits->pArray != (char *)0x0) {
        free(vLits->pArray);
      }
      free(vLits);
    }
    free(pBuffer);
  }
  return p;
}

Assistant:

Pla_Man_t * Pla_ReadPla( char * pFileName )
{   
    Pla_Man_t * p;
    Vec_Str_t * vLits;
    int nIns, nOuts, nCubes, Type;
    char * pBuffer, * pLimit;   
    pBuffer = Pla_ReadFile( pFileName, &pLimit );
    if ( pBuffer == NULL )
        return NULL;
    Pla_ReadPlaRemoveComments( pBuffer, pLimit );
    if ( Pla_ReadPlaHeader( pBuffer, pLimit, &nIns, &nOuts, &nCubes, &Type ) )
    {
        vLits = Pla_ReadPlaBody( pBuffer, pLimit, (Pla_File_t)Type );
        if ( Vec_StrSize(vLits) % (nIns + nOuts) == 0 )
        {
            if ( nCubes == -1 )
                nCubes = Vec_StrSize(vLits) / (nIns + nOuts);
            p = Pla_ManAlloc( pFileName, nIns, nOuts, nCubes );
            p->Type = (Pla_File_t)Type;
            Pla_ReadAddBody( p, vLits );
            Vec_StrFree( vLits );
            ABC_FREE( pBuffer );
            return p;
        }
        printf( "Literal count is incorrect (in = %d; out = %d; lit = %d).\n", nIns, nOuts, Vec_StrSize(vLits) );
        Vec_StrFree( vLits );
    }
    ABC_FREE( pBuffer );
    return NULL;
}